

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_dstr_catf(arg_dstr_t ds,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  size_t local_50;
  size_t slen;
  int r;
  int n;
  char *buff;
  va_list arglist;
  char *fmt_local;
  arg_dstr_t ds_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if (fmt != (char *)0x0) {
    local_f8 = in_RDX;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    sVar1 = strlen(fmt);
    slen._4_4_ = (int)(sVar1 << 1);
    if (slen._4_4_ < 0x10) {
      slen._4_4_ = 0x10;
    }
    _r = (char *)argtable3_xmalloc((long)(slen._4_4_ + 2));
    memset(_r,0,(long)(slen._4_4_ + 2));
    while( true ) {
      arglist[0].overflow_arg_area = local_108;
      arglist[0]._0_8_ = &stack0x00000008;
      buff._4_4_ = 0x30;
      buff._0_4_ = 0x10;
      slen._0_4_ = vsnprintf(_r,(long)(slen._4_4_ + 1),fmt,&buff);
      local_50 = strlen(_r);
      if (local_50 < (ulong)(long)slen._4_4_) break;
      if (slen._4_4_ < (int)slen) {
        slen._4_4_ = (int)slen;
      }
      else {
        slen._4_4_ = slen._4_4_ * 2;
      }
      argtable3_xfree(_r);
      _r = (char *)argtable3_xmalloc((long)(slen._4_4_ + 2));
      memset(_r,0,(long)(slen._4_4_ + 2));
    }
    arg_dstr_cat(ds,_r);
    argtable3_xfree(_r);
  }
  return;
}

Assistant:

void arg_dstr_catf(arg_dstr_t ds, const char* fmt, ...) {
    va_list arglist;
    char* buff;
    int n, r;
    size_t slen;

    if (fmt == NULL)
        return;

    /* Since the length is not determinable beforehand, a search is
       performed using the truncating "vsnprintf" call (to avoid buffer
       overflows) on increasing potential sizes for the output result. */

    if ((n = (int)(2 * strlen(fmt))) < START_VSNBUFF)
        n = START_VSNBUFF;

    buff = (char*)xmalloc((size_t)(n + 2));
    memset(buff, 0, (size_t)(n + 2));

    for (;;) {
        va_start(arglist, fmt);
        r = vsnprintf(buff, (size_t)(n + 1), fmt, arglist);
        va_end(arglist);

        slen = strlen(buff);
        if (slen < (size_t)n)
            break;

        if (r > n)
            n = r;
        else
            n += n;

        xfree(buff);
        buff = (char*)xmalloc((size_t)(n + 2));
        memset(buff, 0, (size_t)(n + 2));
    }

    arg_dstr_cat(ds, buff);
    xfree(buff);
}